

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotScatterEx<ImPlot::GetterYs<unsigned_char>>
               (char *label_id,GetterYs<unsigned_char> *getter)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar7;
  uchar *puVar8;
  uint uVar9;
  ImPlotRange *pIVar10;
  ImPlotContext *pIVar11;
  bool bVar12;
  long lVar13;
  double dVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  GetterYs<unsigned_char> *pGVar19;
  double dVar20;
  float fVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  uchar *puVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  GetterYs<unsigned_char> *local_98;
  long local_90;
  ImU32 local_84;
  ImU32 local_80;
  uint local_7c;
  long local_78;
  ulong local_70;
  double local_68;
  double local_60;
  uchar *local_58;
  double local_50;
  undefined8 local_48;
  ImDrawList *local_40;
  long local_38;
  
  bVar12 = BeginItem(label_id,2);
  pIVar11 = GImPlot;
  if (bVar12) {
    if ((GImPlot->FitThisFrame == true) && (iVar2 = getter->Count, 0 < iVar2)) {
      dVar14 = getter->X0;
      dVar20 = getter->XScale;
      puVar25 = getter->Ys;
      iVar16 = getter->Offset;
      iVar3 = getter->Stride;
      pIVar7 = GImPlot->CurrentPlot;
      iVar4 = pIVar7->CurrentYAxis;
      uVar5 = (pIVar7->XAxis).Flags;
      pIVar10 = GImPlot->ExtentsY;
      uVar6 = pIVar7->YAxis[iVar4].Flags;
      iVar17 = 0;
      uVar15 = uVar6 & 0x20;
      uVar9 = uVar15 >> 5;
      local_90 = CONCAT44(local_90._4_4_,uVar9);
      lVar13 = local_90;
      local_48 = (ImPlotContext *)(CONCAT44(local_48._4_4_,uVar5) & 0xffffffff00000020);
      dVar24 = 0.0;
      do {
        dVar27 = dVar20 * dVar24 + dVar14;
        bVar1 = puVar25[(long)(((iVar16 + iVar17) % iVar2 + iVar2) % iVar2) * (long)iVar3];
        dVar26 = (double)bVar1;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar27) < 0x7ff0000000000000) {
LAB_001d128a:
            if ((0.0 < dVar27) || ((int)local_48 == 0)) {
              dVar28 = (pIVar11->ExtentsX).Min;
              dVar29 = dVar27;
              if (dVar28 <= dVar27) {
                dVar29 = dVar28;
              }
              (pIVar11->ExtentsX).Min = dVar29;
              dVar28 = (pIVar11->ExtentsX).Max;
              dVar29 = dVar27;
              if (dVar27 <= dVar28) {
                dVar29 = dVar28;
              }
              (pIVar11->ExtentsX).Max = dVar29;
            }
          }
        }
        else if ((((long)ABS(dVar27) < 0x7ff0000000000000) &&
                 (pIVar7->YAxis[iVar4].Range.Min <= dVar26)) &&
                (dVar26 <= pIVar7->YAxis[iVar4].Range.Max)) goto LAB_001d128a;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((bVar1 != 0) || (uVar15 == 0)) {
LAB_001d12f6:
            dVar27 = pIVar10[iVar4].Min;
            dVar28 = dVar26;
            if (dVar27 <= dVar26) {
              dVar28 = dVar27;
            }
            pIVar10[iVar4].Min = dVar28;
            dVar27 = pIVar11->ExtentsY[iVar4].Max;
            if (dVar26 <= dVar27) {
              dVar26 = dVar27;
            }
            pIVar11->ExtentsY[iVar4].Max = dVar26;
          }
        }
        else if ((((pIVar7->XAxis).Range.Min <= dVar27) && (dVar27 <= (pIVar7->XAxis).Range.Max)) &&
                (local_90._0_1_ = (byte)uVar9, (bVar1 == 0 & (byte)local_90) == 0))
        goto LAB_001d12f6;
        dVar24 = dVar24 + 1.0;
        iVar17 = iVar17 + 1;
        local_90 = lVar13;
      } while (iVar2 != iVar17);
    }
    local_98 = getter;
    local_40 = GetPlotDrawList();
    iVar2 = (pIVar11->NextItemData).Marker;
    iVar16 = 0;
    if (iVar2 != -1) {
      iVar16 = iVar2;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar11->NextItemData).MarkerSize);
    local_80 = ImGui::GetColorU32((pIVar11->NextItemData).Colors + 2);
    local_84 = ImGui::GetColorU32((pIVar11->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    lVar13 = (long)transformer.YAxis;
    local_48 = GImPlot;
    local_90 = lVar13;
    switch(GImPlot->Scales[lVar13]) {
    case 0:
      iVar2 = local_98->Count;
      if (0 < iVar2) {
        puVar8 = local_98->Ys;
        local_50 = local_98->XScale;
        uVar22 = SUB84(local_50,0);
        uVar23 = (undefined4)((ulong)local_50 >> 0x20);
        puVar25 = (uchar *)local_98->X0;
        dVar14 = (double)(ulong)(uint)local_98->Offset;
        local_68 = (double)CONCAT44(local_68._4_4_,(pIVar11->NextItemData).MarkerSize);
        local_70 = CONCAT44(local_70._4_4_,(pIVar11->NextItemData).MarkerWeight);
        iVar3 = local_98->Stride;
        local_78 = (long)iVar16;
        iVar16 = 0;
        pGVar19 = (GetterYs<unsigned_char> *)0x0;
        local_9c = (float)(uint)(pIVar11->NextItemData).RenderMarkerLine;
        local_a0 = (float)(uint)(pIVar11->NextItemData).RenderMarkerFill;
        local_60 = dVar14;
        local_58 = puVar25;
        do {
          fVar18 = (float)((((double)CONCAT44(uVar23,uVar22) * (double)pGVar19 + (double)puVar25) -
                           (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                          (double)GImPlot->PixelRange[lVar13].Min.x);
          fVar21 = (float)(((double)puVar8[(long)(((SUB84(dVar14,0) + iVar16) % iVar2 + iVar2) %
                                                 iVar2) * (long)iVar3] -
                           GImPlot->CurrentPlot->YAxis[lVar13].Range.Min) * GImPlot->My[local_90] +
                          (double)GImPlot->PixelRange[lVar13].Min.y);
          local_a8 = CONCAT44(fVar21,fVar18);
          pIVar7 = local_48->CurrentPlot;
          if ((((pIVar7->PlotRect).Min.x <= fVar18) && ((pIVar7->PlotRect).Min.y <= fVar21)) &&
             ((fVar18 < (pIVar7->PlotRect).Max.x && (fVar21 < (pIVar7->PlotRect).Max.y)))) {
            local_98 = pGVar19;
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<unsigned_char>>(ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_78 * 8))
                      ((ulong)local_68 & 0xffffffff,local_70 & 0xffffffff,local_40,&local_a8,
                       local_9c,local_80,local_a0,local_84);
            uVar22 = SUB84(local_50,0);
            uVar23 = (undefined4)((ulong)local_50 >> 0x20);
            dVar14 = local_60;
            puVar25 = local_58;
            pGVar19 = local_98;
          }
          pGVar19 = (GetterYs<unsigned_char> *)((double)pGVar19 + 1.0);
          iVar16 = iVar16 + 1;
        } while (iVar2 != iVar16);
      }
      break;
    case 1:
      iVar2 = local_98->Count;
      if (0 < iVar2) {
        local_58 = local_98->Ys;
        local_60 = local_98->XScale;
        local_68 = local_98->X0;
        local_70 = (ulong)(uint)local_98->Offset;
        local_9c = (pIVar11->NextItemData).MarkerSize;
        local_a0 = (pIVar11->NextItemData).MarkerWeight;
        local_78 = (long)local_98->Stride;
        local_38 = (long)iVar16;
        iVar16 = 0;
        pGVar19 = (GetterYs<unsigned_char> *)0x0;
        local_7c = (uint)(pIVar11->NextItemData).RenderMarkerLine;
        bVar12 = (pIVar11->NextItemData).RenderMarkerFill;
        do {
          pIVar11 = GImPlot;
          local_50 = (double)local_58[((((int)local_70 + iVar16) % iVar2 + iVar2) % iVar2) *
                                      local_78];
          local_98 = pGVar19;
          dVar20 = log10((local_60 * (double)pGVar19 + local_68) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar7 = pIVar11->CurrentPlot;
          dVar14 = (pIVar7->XAxis).Range.Min;
          fVar18 = (float)((((double)(float)(dVar20 / pIVar11->LogDenX) *
                             ((pIVar7->XAxis).Range.Max - dVar14) + dVar14) - dVar14) * pIVar11->Mx
                          + (double)pIVar11->PixelRange[lVar13].Min.x);
          fVar21 = (float)((local_50 - pIVar7->YAxis[lVar13].Range.Min) * pIVar11->My[local_90] +
                          (double)pIVar11->PixelRange[lVar13].Min.y);
          local_a8 = CONCAT44(fVar21,fVar18);
          pIVar7 = local_48->CurrentPlot;
          if ((((pIVar7->PlotRect).Min.x <= fVar18) && ((pIVar7->PlotRect).Min.y <= fVar21)) &&
             ((fVar18 < (pIVar7->PlotRect).Max.x && (fVar21 < (pIVar7->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<unsigned_char>>(ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_38 * 8))
                      (local_9c,local_a0,local_40,&local_a8,local_7c,local_80,bVar12,local_84);
          }
          pGVar19 = (GetterYs<unsigned_char> *)((double)local_98 + 1.0);
          iVar16 = iVar16 + 1;
        } while (iVar2 != iVar16);
      }
      break;
    case 2:
      iVar2 = local_98->Count;
      if (0 < iVar2) {
        local_58 = local_98->Ys;
        local_60 = local_98->XScale;
        local_68 = local_98->X0;
        local_70 = (ulong)(uint)local_98->Offset;
        local_9c = (pIVar11->NextItemData).MarkerSize;
        local_a0 = (pIVar11->NextItemData).MarkerWeight;
        local_78 = (long)local_98->Stride;
        local_38 = (long)iVar16;
        iVar16 = 0;
        pGVar19 = (GetterYs<unsigned_char> *)0x0;
        local_7c = (uint)(pIVar11->NextItemData).RenderMarkerLine;
        bVar12 = (pIVar11->NextItemData).RenderMarkerFill;
        do {
          pIVar11 = GImPlot;
          local_50 = local_60 * (double)pGVar19 + local_68;
          local_98 = pGVar19;
          dVar20 = log10((double)local_58[((((int)local_70 + iVar16) % iVar2 + iVar2) % iVar2) *
                                          local_78] / GImPlot->CurrentPlot->YAxis[lVar13].Range.Min)
          ;
          pIVar7 = pIVar11->CurrentPlot;
          dVar14 = pIVar7->YAxis[lVar13].Range.Min;
          fVar21 = (float)((local_50 - (pIVar7->XAxis).Range.Min) * pIVar11->Mx +
                          (double)pIVar11->PixelRange[lVar13].Min.x);
          fVar18 = (float)((((double)(float)(dVar20 / pIVar11->LogDenY[local_90]) *
                             (pIVar7->YAxis[lVar13].Range.Max - dVar14) + dVar14) - dVar14) *
                           pIVar11->My[local_90] + (double)pIVar11->PixelRange[lVar13].Min.y);
          local_a8 = CONCAT44(fVar18,fVar21);
          pIVar7 = local_48->CurrentPlot;
          if (((((pIVar7->PlotRect).Min.x <= fVar21) && ((pIVar7->PlotRect).Min.y <= fVar18)) &&
              (fVar21 < (pIVar7->PlotRect).Max.x)) && (fVar18 < (pIVar7->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<unsigned_char>>(ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_38 * 8))
                      (local_9c,local_a0,local_40,&local_a8,local_7c,local_80,bVar12,local_84);
          }
          pGVar19 = (GetterYs<unsigned_char> *)((double)local_98 + 1.0);
          iVar16 = iVar16 + 1;
        } while (iVar2 != iVar16);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_char>>
                (*local_98,transformer,local_40,iVar16,(pIVar11->NextItemData).MarkerSize,
                 (pIVar11->NextItemData).RenderMarkerLine,local_80,
                 (pIVar11->NextItemData).MarkerWeight,(pIVar11->NextItemData).RenderMarkerFill,
                 local_84);
    }
    pIVar11 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar11->NextItemData);
    pIVar11->PreviousItem = pIVar11->CurrentItem;
    pIVar11->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}